

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_response::to_buffers
          (coro_http_response *this,
          vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *buffers,string *size_str)

{
  basic_string_view<char,_std::char_traits<char>_> data;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  size_t in_RSI;
  status_type *in_RDI;
  string_view sVar2;
  string_view content;
  __sv_type _Var3;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *in_stack_000001e8;
  coro_http_response *in_stack_000001f0;
  value_type *in_stack_ffffffffffffff88;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *in_stack_ffffffffffffff90;
  string *local_48;
  
  sVar2 = to_http_status_string(*in_RDI);
  data._M_str = (char *)in_RDI;
  data._M_len = in_RSI;
  content = (string_view)asio::buffer<char,std::char_traits<char>>(data);
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  build_resp_head(in_stack_000001f0,in_stack_000001e8);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x28034d);
  if (bVar1) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x3c));
    if (!bVar1) {
      handle_content((coro_http_response *)sVar2._M_str,
                     (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)sVar2._M_len
                     ,local_48,content);
    }
  }
  else {
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDX);
    handle_content((coro_http_response *)sVar2._M_str,
                   (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)sVar2._M_len,
                   (string *)_Var3._M_str,content);
  }
  return;
}

Assistant:

void to_buffers(std::vector<asio::const_buffer> &buffers,
                  std::string &size_str) {
    buffers.push_back(asio::buffer(to_http_status_string(status_)));
    build_resp_head(buffers);
    if (!content_.empty()) {
      handle_content(buffers, size_str, content_);
    }
    else if (!content_view_.empty()) {
      handle_content(buffers, size_str, content_view_);
    }
  }